

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCache.cpp
# Opt level: O0

cl_program xmrig::OclCache::build(IOclRunner *runner)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar1;
  cl_program p_Var2;
  long *in_RDI;
  cl_program program;
  cl_program program_1;
  string fileName;
  lock_guard<std::mutex> lock;
  string *in_stack_00000138;
  cl_program in_stack_00000140;
  string *in_stack_000002e0;
  IOclRunner *in_stack_000002e8;
  mutex_type *in_stack_fffffffffffffec8;
  lock_guard<std::mutex> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  IOclRunner *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_e8 [32];
  IOclRunner *in_stack_ffffffffffffff38;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  undefined4 local_28;
  long *local_10;
  cl_program local_8;
  
  local_10 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Nonce::sequence((Backend)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  if (__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_8 = (cl_program)0x0;
    local_28 = 1;
    goto LAB_0020db09;
  }
  std::__cxx11::string::string(local_48);
  lVar1 = (**(code **)(*local_10 + 0x30))();
  if ((*(byte *)(lVar1 + 8) & 1) == 0) {
LAB_0020da74:
    p_Var2 = createFromSource(in_stack_ffffffffffffff38);
    lVar1 = (**(code **)(*local_10 + 0x30))();
    local_8 = p_Var2;
    if (((*(byte *)(lVar1 + 8) & 1) != 0) && (p_Var2 != (cl_program)0x0)) {
      save(in_stack_00000140,in_stack_00000138);
      local_8 = p_Var2;
    }
  }
  else {
    prefix_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
    cacheKey_abi_cxx11_(in_stack_fffffffffffffee8);
    std::operator+(in_stack_ffffffffffffff08,__rhs);
    std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
    std::__cxx11::string::operator=(local_48,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    local_8 = createFromBinary(in_stack_000002e8,in_stack_000002e0);
    if (local_8 == (cl_program)0x0) goto LAB_0020da74;
  }
  local_28 = 1;
  std::__cxx11::string::~string(local_48);
LAB_0020db09:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20db16);
  return local_8;
}

Assistant:

cl_program xmrig::OclCache::build(const IOclRunner *runner)
{
    std::lock_guard<std::mutex> lock(mutex);

    if (Nonce::sequence(Nonce::OPENCL) == 0) {
        return nullptr;
    }

    std::string fileName;
    if (runner->data().cache) {
#       ifdef _WIN32
        fileName = prefix() + "\\xmrig\\.cache\\" + cacheKey(runner) + ".bin";
#       else
        fileName = prefix() + "/.cache/" + cacheKey(runner) + ".bin";
#       endif

        cl_program program = createFromBinary(runner, fileName);
        if (program) {
            return program;
        }
    }

    cl_program program = createFromSource(runner);
    if (runner->data().cache && program) {
        save(program, fileName);
    }

    return program;
}